

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetAttributesWithPropertyIndex
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,
          BigPropertyIndex index,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  PropertyAttributes PVar3;
  uint16 uVar4;
  int iVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  ObjectSlotAttributes **ppOVar8;
  PropertyAttributes *attributes_local;
  BigPropertyIndex index_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  uVar4 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  if (index < (int)(uint)uVar4) {
    pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    iVar5 = (*(this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler
              ._vptr_DynamicTypeHandler[9])(this,pSVar6,(ulong)(uint)index);
    if (iVar5 != propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xf62,
                                  "(this->GetPropertyId(instance->GetScriptContext(), index) == propertyId)"
                                  ,
                                  "this->GetPropertyId(instance->GetScriptContext(), index) == propertyId"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    PVar3 = PathTypeHandlerBase::ObjectSlotAttributesToPropertyAttributes((*ppOVar8)[index]);
    *attributes = PVar3;
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetAttributesWithPropertyIndex(DynamicObject * instance, PropertyId propertyId, BigPropertyIndex index, PropertyAttributes * attributes)
    {
        if (index < this->GetPathLength())
        {
            Assert(this->GetPropertyId(instance->GetScriptContext(), index) == propertyId);
            *attributes = ObjectSlotAttributesToPropertyAttributes(this->attributes[index]);
            return true;
        }
        return false;
    }